

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O3

LIBSSH2_SFTP * libssh2_sftp_init(LIBSSH2_SESSION *session)

{
  uint32_t *out;
  undefined8 uVar1;
  uchar *puVar2;
  libssh2_nonblocking_states lVar3;
  int iVar4;
  time_t start_time;
  LIBSSH2_CHANNEL *pLVar5;
  LIBSSH2_SFTP *sftp;
  ssize_t sVar6;
  size_t sVar7;
  char *pcVar8;
  uchar *buf_00;
  uchar *buf_01;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uchar *data;
  size_t data_len;
  string_buf buf;
  size_t name_len;
  uchar *extdata;
  uchar *extname;
  uchar *local_90;
  size_t local_88;
  uchar *local_80;
  uchar *local_78;
  string_buf local_70;
  LIBSSH2_SFTP **local_58;
  size_t local_50;
  size_t local_48;
  uchar *local_40;
  uchar *local_38;
  
  if (session != (LIBSSH2_SESSION *)0x0) {
    if ((session->state & 8) != 0) {
      start_time = time((time_t *)0x0);
      local_58 = &session->sftpInit_sftp;
      buf_01 = session->sftpInit_buffer;
      buf_00 = session->sftpInit_buffer + 5;
LAB_00123f2f:
      local_88 = 0;
      lVar3 = session->sftpInit_state;
      sftp = session->sftpInit_sftp;
      switch(lVar3) {
      case libssh2_NB_state_idle:
        goto switchD_00123f5d_caseD_0;
      default:
        goto switchD_00123f5d_caseD_1;
      case libssh2_NB_state_created:
        goto switchD_00123f5d_caseD_2;
      case libssh2_NB_state_sent:
        pLVar5 = session->sftpInit_channel;
        goto LAB_00123fc2;
      case libssh2_NB_state_sent1:
        goto switchD_00123f5d_caseD_4;
      case libssh2_NB_state_sent2:
        sVar7 = session->sftpInit_sent;
        goto LAB_001240ac;
      }
    }
    _libssh2_error(session,-0x22,"session not authenticated yet");
  }
  return (LIBSSH2_SFTP *)0x0;
switchD_00123f5d_caseD_0:
  if (sftp != (LIBSSH2_SFTP *)0x0) {
    __assert_fail("!session->sftpInit_sftp",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/palmin[P]libssh2/src/sftp.c"
                  ,0x34d,"LIBSSH2_SFTP *sftp_init(LIBSSH2_SESSION *)");
  }
  session->sftpInit_state = libssh2_NB_state_created;
switchD_00123f5d_caseD_2:
  pLVar5 = _libssh2_channel_open(session,"session",7,0x200000,0x8000,(uchar *)0x0,0);
  session->sftpInit_channel = pLVar5;
  if (pLVar5 == (LIBSSH2_CHANNEL *)0x0) {
    iVar4 = libssh2_session_last_errno(session);
    if (iVar4 == -0x25) {
      pcVar8 = "Would block starting up channel";
      goto LAB_001241e5;
    }
    _libssh2_error(session,-0x15,"Unable to startup channel");
LAB_00124217:
    session->sftpInit_state = libssh2_NB_state_idle;
  }
  else {
    session->sftpInit_state = libssh2_NB_state_sent;
LAB_00123fc2:
    iVar4 = _libssh2_channel_process_startup(pLVar5,"subsystem",9,"sftp",4);
    if (iVar4 == 0) {
      session->sftpInit_state = libssh2_NB_state_sent1;
switchD_00123f5d_caseD_4:
      iVar4 = _libssh2_channel_extended_data(session->sftpInit_channel,1);
      if (iVar4 != -0x25) {
        sftp = (LIBSSH2_SFTP *)_libssh2_calloc(session,0x170);
        session->sftpInit_sftp = sftp;
        if (sftp == (LIBSSH2_SFTP *)0x0) {
          iVar4 = -6;
          pcVar8 = "Unable to allocate a new SFTP structure";
          goto LAB_001242b1;
        }
        sftp->channel = session->sftpInit_channel;
        sftp->request_id = 0;
        _libssh2_htonu32(buf_01,5);
        session->sftpInit_buffer[4] = '\x01';
        _libssh2_htonu32(buf_00,3);
        session->sftpInit_sent = 0;
        session->sftpInit_state = libssh2_NB_state_sent2;
        sVar7 = 0;
LAB_001240ac:
        sVar6 = _libssh2_channel_write(session->sftpInit_channel,0,buf_01 + sVar7,9 - sVar7);
        if (sVar6 == -0x25) {
          pcVar8 = "Would block sending SSH_FXP_INIT";
          goto LAB_001241e5;
        }
        if (sVar6 < 0) {
          iVar4 = -7;
          pcVar8 = "Unable to send SSH_FXP_INIT";
LAB_001242b1:
          _libssh2_error(session,iVar4,pcVar8);
        }
        else {
          sVar7 = sVar6 + session->sftpInit_sent;
          session->sftpInit_sent = sVar7;
          if (sVar7 == 9) {
            session->sftpInit_state = libssh2_NB_state_sent3;
          }
          else {
            lVar3 = session->sftpInit_state;
switchD_00123f5d_caseD_1:
            if (lVar3 == libssh2_NB_state_error_closing) {
              iVar4 = _libssh2_channel_free(session->sftpInit_channel);
              if (iVar4 != -0x25) {
                session->sftpInit_channel = (LIBSSH2_CHANNEL *)0x0;
                if (session->sftpInit_sftp != (LIBSSH2_SFTP *)0x0) {
                  (*session->free)(session->sftpInit_sftp,&session->abstract);
                  session->sftpInit_sftp = (LIBSSH2_SFTP *)0x0;
                }
                goto LAB_00124217;
              }
              pcVar8 = "Would block closing channel";
              goto LAB_001241e5;
            }
          }
          iVar4 = sftp_packet_require(sftp,'\x02',0,&local_90,&local_88,5);
          sVar7 = local_88;
          puVar2 = local_90;
          if (iVar4 == -0x26) {
            if (local_88 != 0) {
              (*session->free)(local_90,&session->abstract);
            }
            iVar4 = -0x1f;
            pcVar8 = "Invalid SSH_FXP_VERSION response";
            goto LAB_001242b1;
          }
          if (iVar4 != 0) {
            if (iVar4 == -0x25) {
              pcVar8 = "Would block receiving SSH_FXP_VERSION";
              goto LAB_001241e5;
            }
            pcVar8 = "Timeout waiting for response from SFTP subsystem";
            goto LAB_001242b1;
          }
          local_70.data = local_90;
          local_70.dataptr = local_90 + 1;
          local_70.len = local_88;
          out = &sftp->version;
          local_80 = buf_01;
          local_78 = buf_00;
          iVar4 = _libssh2_get_u32(&local_70,out);
          buf_00 = local_78;
          if (iVar4 == 0) {
            if (3 < *out) {
              *out = 3;
            }
            while( true ) {
              if (puVar2 + sVar7 <= local_70.dataptr) {
                (*session->free)(local_90,&session->abstract);
                pLVar5 = sftp->channel;
                pLVar5->abstract = sftp;
                pLVar5->close_cb = libssh2_sftp_dtor;
                session->sftpInit_state = libssh2_NB_state_idle;
                *local_58 = (LIBSSH2_SFTP *)0x0;
                local_58[1] = (LIBSSH2_SFTP *)0x0;
                _libssh2_list_init(&sftp->sftp_handles);
                return sftp;
              }
              iVar4 = _libssh2_get_string(&local_70,&local_38,&local_48);
              if (iVar4 != 0) {
                (*session->free)(local_90,&session->abstract);
                pcVar8 = "Data too short when extracting extname";
                goto LAB_001243d2;
              }
              iVar4 = _libssh2_get_string(&local_70,&local_40,&local_50);
              if (iVar4 != 0) break;
              if (local_48 == 0x18) {
                auVar9[0] = -(*local_38 == 'p');
                auVar9[1] = -(local_38[1] == 'o');
                auVar9[2] = -(local_38[2] == 's');
                auVar9[3] = -(local_38[3] == 'i');
                auVar9[4] = -(local_38[4] == 'x');
                auVar9[5] = -(local_38[5] == '-');
                auVar9[6] = -(local_38[6] == 'r');
                auVar9[7] = -(local_38[7] == 'e');
                auVar9[8] = -(local_38[8] == 'n');
                auVar9[9] = -(local_38[9] == 'a');
                auVar9[10] = -(local_38[10] == 'm');
                auVar9[0xb] = -(local_38[0xb] == 'e');
                auVar9[0xc] = -(local_38[0xc] == '@');
                auVar9[0xd] = -(local_38[0xd] == 'o');
                auVar9[0xe] = -(local_38[0xe] == 'p');
                auVar9[0xf] = -(local_38[0xf] == 'e');
                uVar1 = *(undefined8 *)(local_38 + 0x10);
                auVar10[0] = -((char)uVar1 == 'n');
                auVar10[1] = -((char)((ulong)uVar1 >> 8) == 's');
                auVar10[2] = -((char)((ulong)uVar1 >> 0x10) == 's');
                auVar10[3] = -((char)((ulong)uVar1 >> 0x18) == 'h');
                auVar10[4] = -((char)((ulong)uVar1 >> 0x20) == '.');
                auVar10[5] = -((char)((ulong)uVar1 >> 0x28) == 'c');
                auVar10[6] = -((char)((ulong)uVar1 >> 0x30) == 'o');
                auVar10[7] = -((char)((ulong)uVar1 >> 0x38) == 'm');
                auVar10[8] = 0xff;
                auVar10[9] = 0xff;
                auVar10[10] = 0xff;
                auVar10[0xb] = 0xff;
                auVar10[0xc] = 0xff;
                auVar10[0xd] = 0xff;
                auVar10[0xe] = 0xff;
                auVar10[0xf] = 0xff;
                auVar10 = auVar10 & auVar9;
                if (((local_50 == 1) &&
                    ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                             (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) == 0xffff)) &&
                   (*local_40 == '1')) {
                  sftp->posix_rename_extension = 1;
                }
              }
            }
            (*session->free)(local_90,&session->abstract);
            pcVar8 = "Data too short when extracting extdata";
LAB_001243d2:
            _libssh2_error(session,-0x26,pcVar8);
            buf_01 = local_80;
          }
          else {
            (*session->free)(local_90,&session->abstract);
            buf_00 = local_78;
            buf_01 = local_80;
          }
        }
        session->sftpInit_state = libssh2_NB_state_error_closing;
        goto LAB_001242c0;
      }
      pcVar8 = "Would block requesting handle extended data";
    }
    else {
      if (iVar4 != -0x25) {
        iVar4 = -0x15;
        pcVar8 = "Unable to request SFTP subsystem";
        goto LAB_001242b1;
      }
      pcVar8 = "Would block to request SFTP subsystem";
    }
LAB_001241e5:
    _libssh2_error(session,-0x25,pcVar8);
  }
LAB_001242c0:
  if (session->api_block_mode == 0) {
    return (LIBSSH2_SFTP *)0x0;
  }
  iVar4 = libssh2_session_last_errno(session);
  if (iVar4 != -0x25) {
    return (LIBSSH2_SFTP *)0x0;
  }
  iVar4 = _libssh2_wait_socket(session,start_time);
  if (iVar4 != 0) {
    return (LIBSSH2_SFTP *)0x0;
  }
  goto LAB_00123f2f;
}

Assistant:

LIBSSH2_API LIBSSH2_SFTP *libssh2_sftp_init(LIBSSH2_SESSION *session)
{
    LIBSSH2_SFTP *ptr;

    if(!session)
        return NULL;

    if(!(session->state & LIBSSH2_STATE_AUTHENTICATED)) {
        _libssh2_error(session, LIBSSH2_ERROR_INVAL,
                       "session not authenticated yet");
        return NULL;
    }

    BLOCK_ADJUST_ERRNO(ptr, session, sftp_init(session));
    return ptr;
}